

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QSharedDataPointer<QNetworkInterfacePrivate>>::
emplace<QSharedDataPointer<QNetworkInterfacePrivate>>
          (QMovableArrayOps<QSharedDataPointer<QNetworkInterfacePrivate>> *this,qsizetype i,
          QSharedDataPointer<QNetworkInterfacePrivate> *args)

{
  undefined8 *puVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  QNetworkInterfacePrivate *pQVar5;
  long lVar6;
  totally_ordered_wrapper<QNetworkInterfacePrivate_*> __old_val;
  long in_FS_OFFSET;
  QSharedDataPointer<QNetworkInterfacePrivate> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = *(int **)this;
  if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
LAB_001ba9f4:
    pQVar5 = (args->d).ptr;
    (args->d).ptr = (QNetworkInterfacePrivate *)0x0;
    lVar3 = *(long *)(this + 0x10);
    QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_>::detachAndGrow
              ((QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)this,
               (uint)(i == 0 && lVar3 != 0),1,(QSharedDataPointer<QNetworkInterfacePrivate> **)0x0,
               (QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)0x0);
    lVar6 = *(long *)(this + 8);
    if (i == 0 && lVar3 != 0) {
      *(QNetworkInterfacePrivate **)(lVar6 + -8) = pQVar5;
      *(long *)(this + 8) = *(long *)(this + 8) + -8;
    }
    else {
      puVar1 = (undefined8 *)(lVar6 + i * 8);
      memmove(puVar1 + 1,(void *)(lVar6 + i * 8),(*(long *)(this + 0x10) - i) * 8);
      *puVar1 = pQVar5;
    }
    local_38.d.ptr =
         (totally_ordered_wrapper<QNetworkInterfacePrivate_*>)(QNetworkInterfacePrivate *)0x0;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    QSharedDataPointer<QNetworkInterfacePrivate>::~QSharedDataPointer(&local_38);
  }
  else {
    if ((*(long *)(this + 0x10) == i) &&
       (lVar3 = *(long *)(this + 8),
       *(long *)(piVar2 + 2) !=
       ((long)(lVar3 - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 3) + i)) {
      pQVar5 = (args->d).ptr;
      (args->d).ptr = (QNetworkInterfacePrivate *)0x0;
      *(QNetworkInterfacePrivate **)(lVar3 + i * 8) = pQVar5;
    }
    else {
      if ((i != 0) ||
         (uVar4 = *(ulong *)(this + 8), ((long)piVar2 + 0x1fU & 0xfffffffffffffff0) == uVar4))
      goto LAB_001ba9f4;
      pQVar5 = (args->d).ptr;
      (args->d).ptr = (QNetworkInterfacePrivate *)0x0;
      *(QNetworkInterfacePrivate **)(uVar4 - 8) = pQVar5;
      *(long *)(this + 8) = *(long *)(this + 8) + -8;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }